

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_or_listen_error_after_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&server,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_close(&server,0);
    iVar1 = uv_pipe_bind(&server,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      iVar1 = uv_listen(&server,0x1000,0);
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(uv_default_loop())";
          pcVar3 = "0";
          uVar2 = 0xb4;
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar2 = 0xb2;
        }
      }
      else {
        pcVar4 = "UV_EINVAL";
        pcVar3 = "uv_listen((uv_stream_t*) &server, 4096, ((void*)0))";
        uVar2 = 0xb0;
      }
    }
    else {
      pcVar4 = "UV_EINVAL";
      pcVar3 = "uv_pipe_bind(&server, \"/tmp/uv-test-sock\")";
      uVar2 = 0xae;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_pipe_init(uv_default_loop(), &server, 0)";
    uVar2 = 0xab;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_or_listen_error_after_close) {
  uv_pipe_t server;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &server, 0));
  uv_close((uv_handle_t*) &server, NULL);

  ASSERT_EQ(uv_pipe_bind(&server, TEST_PIPENAME), UV_EINVAL);

  ASSERT_EQ(uv_listen((uv_stream_t*) &server, SOMAXCONN, NULL), UV_EINVAL);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}